

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::ComparisonTest_Matching_Unknown_Test::TestBody
          (ComparisonTest_Matching_Unknown_Test *this)

{
  UnknownFieldSet *pUVar1;
  char *message;
  string_view value;
  AssertHelper local_50;
  AssertionResult gtest_ar;
  string local_38;
  
  pUVar1 = UnknownFieldSet::AddGroup((this->super_ComparisonTest).unknown1_,0xf5);
  UnknownFieldSet::AddFixed32(pUVar1,0xf8,1);
  pUVar1 = UnknownFieldSet::AddGroup((this->super_ComparisonTest).unknown2_,0xf5);
  UnknownFieldSet::AddFixed32(pUVar1,0xf8,1);
  pUVar1 = UnknownFieldSet::AddGroup((this->super_ComparisonTest).unknown1_,0xf5);
  UnknownFieldSet::AddFixed32(pUVar1,0xf8,3);
  pUVar1 = UnknownFieldSet::AddGroup((this->super_ComparisonTest).unknown2_,0xf5);
  UnknownFieldSet::AddFixed32(pUVar1,0xf8,3);
  value._M_str = "cat";
  value._M_len = 3;
  UnknownFieldSet::AddLengthDelimited((this->super_ComparisonTest).unknown2_,0xf2,value);
  pUVar1 = UnknownFieldSet::AddGroup((this->super_ComparisonTest).unknown2_,0xf6);
  UnknownFieldSet::AddFixed32(pUVar1,0xf8,4);
  protobuf::(anonymous_namespace)::ComparisonTest::RunUn_abi_cxx11_(&local_38,this);
  testing::internal::CmpHelperEQ<char[45],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"added: 242[0]: \\\"cat\\\"\\n\" \"added: 246[0]: { ... }\\n\""
             ,"RunUn()",(char (*) [45])"added: 242[0]: \"cat\"\nadded: 246[0]: { ... }\n",&local_38)
  ;
  std::__cxx11::string::~string((string *)&local_38);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_38);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = anon_var_dwarf_651463 + 5;
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xd27,message);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(ComparisonTest, Matching_Unknown) {
  unknown1_->AddGroup(245)->AddFixed32(248, 1);
  unknown2_->AddGroup(245)->AddFixed32(248, 1);
  unknown1_->AddGroup(245)->AddFixed32(248, 3);
  unknown2_->AddGroup(245)->AddFixed32(248, 3);
  unknown2_->AddLengthDelimited(242, "cat");
  unknown2_->AddGroup(246)->AddFixed32(248, 4);

  // report_match is false so only added/modified fields are expected.
  EXPECT_EQ(
      "added: 242[0]: \"cat\"\n"
      "added: 246[0]: { ... }\n",
      RunUn());
}